

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.h
# Opt level: O0

void __thiscall roaring::Roaring::~Roaring(Roaring *this)

{
  long in_RDI;
  
  if ((*(byte *)(in_RDI + 0x20) & 2) == 0) {
    roaring_bitmap_clear((roaring_bitmap_t *)0x102739);
  }
  else {
    roaring_bitmap_free((roaring_bitmap_t *)0x10274f);
  }
  return;
}

Assistant:

inline void roaring_bitmap_init_cleared(roaring_bitmap_t *r) {
    roaring_bitmap_init_with_capacity(r, 0);
}